

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O2

void __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyCase::initPrograms
          (BufferSparseResidencyCase *this,SourceCollections *sourceCollections)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  ostringstream src;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [40];
  ostringstream local_198 [376];
  
  pcVar1 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 0, std430) readonly buffer Input\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tuint data[];\n");
  poVar2 = std::operator<<(poVar2,"} sb_in;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1, std430) writeonly buffer Output\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tuint result[];\n");
  poVar2 = std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\tfor(int i=0; i<");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"; ++i) \n");
  poVar2 = std::operator<<(poVar2,"\t{\n");
  poVar2 = std::operator<<(poVar2,"\t\tsb_out.result[i] = sb_in.data[i];");
  poVar2 = std::operator<<(poVar2,"\t}\n");
  std::operator<<(poVar2,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"comp",&local_201);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void BufferSparseResidencyCase::initPrograms (SourceCollections& sourceCollections) const
{
	const char* const	versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	const deUint32		iterationsCount = m_bufferSize / SIZE_OF_UINT_IN_SHADER;

	std::ostringstream src;

	src << versionDecl << "\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) readonly buffer Input\n"
		<< "{\n"
		<< "	uint data[];\n"
		<< "} sb_in;\n"
		<< "\n"
		<< "layout(set = 0, binding = 1, std430) writeonly buffer Output\n"
		<< "{\n"
		<< "	uint result[];\n"
		<< "} sb_out;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	for(int i=0; i<" << iterationsCount << "; ++i) \n"
		<< "	{\n"
		<< "		sb_out.result[i] = sb_in.data[i];"
		<< "	}\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}